

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

string * __thiscall
cfd::core::KeyData::ToString_abi_cxx11_
          (string *__return_storage_ptr__,KeyData *this,bool has_pubkey,HardenedType hardened_type,
          bool has_hex)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  stringstream local_1d0 [8];
  stringstream ss;
  ostream local_1c0 [376];
  undefined1 local_48 [8];
  string path_str;
  bool has_hex_local;
  HardenedType hardened_type_local;
  bool has_pubkey_local;
  KeyData *this_local;
  
  path_str.field_2._M_local_buf[0xf] = has_hex;
  GetBip32Path_abi_cxx11_((string *)local_48,this,hardened_type,has_hex);
  ::std::__cxx11::stringstream::stringstream(local_1d0);
  uVar2 = ::std::__cxx11::string::empty();
  if (((uVar2 & 1) == 0) && (bVar1 = ByteData::IsEmpty(&this->fingerprint_), !bVar1)) {
    poVar3 = ::std::operator<<(local_1c0,"[");
    ByteData::GetHex_abi_cxx11_(&local_200,&this->fingerprint_);
    poVar3 = ::std::operator<<(poVar3,(string *)&local_200);
    poVar3 = ::std::operator<<(poVar3,"/");
    poVar3 = ::std::operator<<(poVar3,(string *)local_48);
    ::std::operator<<(poVar3,"]");
    ::std::__cxx11::string::~string((string *)&local_200);
  }
  if (has_pubkey) {
    Pubkey::GetHex_abi_cxx11_(&local_220,&this->pubkey_);
    ::std::operator<<(local_1c0,(string *)&local_220);
    ::std::__cxx11::string::~string((string *)&local_220);
  }
  else {
    bVar1 = ExtPrivkey::IsValid(&this->extprivkey_);
    if (bVar1) {
      ExtPrivkey::ToString_abi_cxx11_(&local_240,&this->extprivkey_);
      ::std::operator<<(local_1c0,(string *)&local_240);
      ::std::__cxx11::string::~string((string *)&local_240);
    }
    else {
      bVar1 = ExtPubkey::IsValid(&this->extpubkey_);
      if (bVar1) {
        ExtPubkey::ToString_abi_cxx11_(&local_260,&this->extpubkey_);
        ::std::operator<<(local_1c0,(string *)&local_260);
        ::std::__cxx11::string::~string((string *)&local_260);
      }
      else {
        bVar1 = Privkey::IsValid(&this->privkey_);
        if (bVar1) {
          Privkey::GetWif_abi_cxx11_(&local_280,&this->privkey_);
          ::std::operator<<(local_1c0,(string *)&local_280);
          ::std::__cxx11::string::~string((string *)&local_280);
        }
        else {
          Pubkey::GetHex_abi_cxx11_(&local_2a0,&this->pubkey_);
          ::std::operator<<(local_1c0,(string *)&local_2a0);
          ::std::__cxx11::string::~string((string *)&local_2a0);
        }
      }
    }
  }
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1d0);
  ::std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string KeyData::ToString(
    bool has_pubkey, HardenedType hardened_type, bool has_hex) const {
  auto path_str = GetBip32Path(hardened_type, has_hex);
  std::stringstream ss;
  if ((!path_str.empty()) && (!fingerprint_.IsEmpty())) {
    ss << "[" << fingerprint_.GetHex() << "/" << path_str << "]";
  }
  if (has_pubkey) {
    ss << pubkey_.GetHex();
  } else if (extprivkey_.IsValid()) {
    ss << extprivkey_.ToString();
  } else if (extpubkey_.IsValid()) {
    ss << extpubkey_.ToString();
  } else if (privkey_.IsValid()) {
    ss << privkey_.GetWif();
  } else {
    ss << pubkey_.GetHex();
  }
  return ss.str();
}